

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-gtest-all.cc
# Opt level: O2

FilePath * __thiscall
testing::internal::FilePath::RemoveTrailingPathSeparator
          (FilePath *__return_storage_ptr__,FilePath *this)

{
  size_type sVar1;
  string local_30;
  
  sVar1 = (this->pathname_)._M_string_length;
  if ((sVar1 == 0) || ((this->pathname_)._M_dataplus._M_p[sVar1 - 1] != '/')) {
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)this);
  }
  else {
    std::__cxx11::string::substr((ulong)&local_30,(ulong)this);
    FilePath(__return_storage_ptr__,&local_30);
    std::__cxx11::string::~string((string *)&local_30);
  }
  return __return_storage_ptr__;
}

Assistant:

FilePath FilePath::RemoveTrailingPathSeparator() const {
  return IsDirectory()
      ? FilePath(pathname_.substr(0, pathname_.length() - 1))
      : *this;
}